

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O0

char * Timidity::SourceToString(USHORT usSource)

{
  char *pcStack_10;
  USHORT usSource_local;
  
  if (usSource == 0) {
    pcStack_10 = "NONE";
  }
  else if (usSource == 1) {
    pcStack_10 = "LFO";
  }
  else if (usSource == 2) {
    pcStack_10 = "KEYONVELOCITY";
  }
  else if (usSource == 3) {
    pcStack_10 = "KEYNUMBER";
  }
  else if (usSource == 4) {
    pcStack_10 = "EG1";
  }
  else if (usSource == 5) {
    pcStack_10 = "EG2";
  }
  else if (usSource == 6) {
    pcStack_10 = "PITCHWHEEL";
  }
  else if (usSource == 7) {
    pcStack_10 = "POLYPRESSURE";
  }
  else if (usSource == 8) {
    pcStack_10 = "CHANNELPRESSURE";
  }
  else if (usSource == 9) {
    pcStack_10 = "VIBRATO";
  }
  else if (usSource == 10) {
    pcStack_10 = "MONOPRESSURE";
  }
  else if (usSource == 0x81) {
    pcStack_10 = "CC1";
  }
  else if (usSource == 0x87) {
    pcStack_10 = "CC7";
  }
  else if (usSource == 0x8a) {
    pcStack_10 = "CC10";
  }
  else if (usSource == 0x8b) {
    pcStack_10 = "CC11";
  }
  else if (usSource == 0xdb) {
    pcStack_10 = "CC91";
  }
  else if (usSource == 0xdd) {
    pcStack_10 = "CC93";
  }
  else {
    mysnprintf(SourceToString::unknown,0x20,"UNKNOWN (0x%04x)",(ulong)usSource);
    pcStack_10 = SourceToString::unknown;
  }
  return pcStack_10;
}

Assistant:

static const char *SourceToString(USHORT usSource)
{
	static char unknown[32];
	switch(usSource) {
		case CONN_SRC_NONE:
			return "NONE";
		case CONN_SRC_LFO:
			return "LFO";
		case CONN_SRC_KEYONVELOCITY:
			return "KEYONVELOCITY";
		case CONN_SRC_KEYNUMBER:
			return "KEYNUMBER";
		case CONN_SRC_EG1:
			return "EG1";
		case CONN_SRC_EG2:
			return "EG2";
		case CONN_SRC_PITCHWHEEL:
			return "PITCHWHEEL";
		case CONN_SRC_CC1:
			return "CC1";
		case CONN_SRC_CC7:
			return "CC7";
		case CONN_SRC_CC10:
			return "CC10";
		case CONN_SRC_CC11:
			return "CC11";
		case CONN_SRC_POLYPRESSURE:
			return "POLYPRESSURE";
		case CONN_SRC_CHANNELPRESSURE:
			return "CHANNELPRESSURE";
		case CONN_SRC_VIBRATO:
			return "VIBRATO";
		case CONN_SRC_MONOPRESSURE:
			return "MONOPRESSURE";
		case CONN_SRC_CC91:
			return "CC91";
		case CONN_SRC_CC93:
			return "CC93";
		default:
			mysnprintf(unknown, countof(unknown), "UNKNOWN (0x%04x)", usSource);
			return unknown;
	}
}